

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O2

void * X509V3_EXT_d2i(X509_EXTENSION *ext)

{
  X509V3_EXT_METHOD *pXVar1;
  ASN1_VALUE *val;
  ASN1_VALUE *pAVar2;
  uchar *p;
  
  pXVar1 = X509V3_EXT_get(ext);
  if (pXVar1 == (X509V3_EXT_METHOD *)0x0) {
    pAVar2 = (ASN1_VALUE *)0x0;
  }
  else {
    p = ext->value->data;
    val = ASN1_item_d2i((ASN1_VALUE **)0x0,&p,(long)ext->value->length,pXVar1->it);
    pAVar2 = (ASN1_VALUE *)0x0;
    if ((val != (ASN1_VALUE *)0x0) && (pAVar2 = val, p != ext->value->data + ext->value->length)) {
      ASN1_item_free(val,pXVar1->it);
      ERR_put_error(0x14,0,0xa4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                    ,0x98);
      pAVar2 = (ASN1_VALUE *)0x0;
    }
  }
  return pAVar2;
}

Assistant:

void *X509V3_EXT_d2i(const X509_EXTENSION *ext) {
  const X509V3_EXT_METHOD *method;
  const unsigned char *p;

  if (!(method = X509V3_EXT_get(ext))) {
    return NULL;
  }
  p = ext->value->data;
  void *ret =
      ASN1_item_d2i(NULL, &p, ext->value->length, ASN1_ITEM_ptr(method->it));
  if (ret == NULL) {
    return NULL;
  }
  // Check for trailing data.
  if (p != ext->value->data + ext->value->length) {
    ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ret),
                   ASN1_ITEM_ptr(method->it));
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_TRAILING_DATA_IN_EXTENSION);
    return NULL;
  }
  return ret;
}